

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O3

void __thiscall
flatbuffers::python::PythonGenerator::GenUnPackForStruct
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  IdlNamer *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 *puVar3;
  long *plVar4;
  long *plVar5;
  size_type *psVar6;
  ulong *puVar7;
  ulong uVar8;
  undefined8 uVar9;
  Value *type;
  string package_reference;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string field_type;
  string field_method;
  string struct_var;
  string field_field;
  string local_220;
  ulong *local_200;
  long local_1f8;
  ulong local_1f0;
  long lStack_1e8;
  long *local_1e0;
  long local_1d8;
  long local_1d0;
  long lStack_1c8;
  string *local_1c0;
  string local_1b8;
  string local_198;
  long *local_178;
  long local_170;
  long local_168;
  long lStack_160;
  StructDef *local_158;
  ulong *local_150;
  long local_148;
  ulong local_140;
  long lStack_138;
  string local_130;
  string local_110;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  this_00 = &this->namer_;
  local_1c0 = code_ptr;
  local_158 = struct_def;
  (*(this->namer_).super_Namer._vptr_Namer[7])(local_90,this_00);
  (*(this->namer_).super_Namer._vptr_Namer[0x12])(local_70,this_00,field);
  (*(this_00->super_Namer)._vptr_Namer[4])(local_b0,this_00,field);
  type = &field->value;
  GenTypeGet_abi_cxx11_(&local_130,this,&type->type);
  if ((((this->super_BaseGenerator).parser_)->opts).include_dependence_headers == true) {
    GenPackageReference_abi_cxx11_(&local_220,this,&type->type);
    local_200 = &local_1f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_200,local_220._M_dataplus._M_p,
               local_220._M_dataplus._M_p + local_220._M_string_length);
    std::__cxx11::string::append((char *)&local_200);
    GenTypeGet_abi_cxx11_(&local_1b8,this,&type->type);
    uVar8 = 0xf;
    if (local_200 != &local_1f0) {
      uVar8 = local_1f0;
    }
    if (uVar8 < local_1b8._M_string_length + local_1f8) {
      uVar9 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        uVar9 = local_1b8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar9 < local_1b8._M_string_length + local_1f8) goto LAB_0028cc63;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1b8,0,(char *)0x0,(ulong)local_200);
    }
    else {
LAB_0028cc63:
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_200,(ulong)local_1b8._M_dataplus._M_p)
      ;
    }
    local_1e0 = &local_1d0;
    plVar4 = puVar3 + 2;
    if ((long *)*puVar3 == plVar4) {
      local_1d0 = *plVar4;
      lStack_1c8 = puVar3[3];
    }
    else {
      local_1d0 = *plVar4;
      local_1e0 = (long *)*puVar3;
    }
    local_1d8 = puVar3[1];
    *puVar3 = plVar4;
    puVar3[1] = 0;
    *(undefined1 *)plVar4 = 0;
    std::__cxx11::string::operator=((string *)&local_130,(string *)&local_1e0);
    if (local_1e0 != &local_1d0) {
      operator_delete(local_1e0,local_1d0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    if (local_200 != &local_1f0) {
      operator_delete(local_200,local_1f0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
  }
  GenIndents_abi_cxx11_(&local_198,this,2);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_198);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_168 = *plVar5;
    lStack_160 = plVar4[3];
    local_178 = &local_168;
  }
  else {
    local_168 = *plVar5;
    local_178 = (long *)*plVar4;
  }
  local_170 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_178,(ulong)local_90[0]);
  paVar2 = &local_1b8.field_2;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_1b8.field_2._M_allocated_capacity = *psVar6;
    local_1b8.field_2._8_8_ = plVar4[3];
    local_1b8._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_1b8.field_2._M_allocated_capacity = *psVar6;
    local_1b8._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_1b8._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1b8);
  local_200 = &local_1f0;
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_1f0 = *puVar7;
    lStack_1e8 = plVar4[3];
  }
  else {
    local_1f0 = *puVar7;
    local_200 = (ulong *)*plVar4;
  }
  local_1f8 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_200,(ulong)local_b0[0]);
  local_1e0 = &local_1d0;
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_1d0 = *plVar5;
    lStack_1c8 = plVar4[3];
  }
  else {
    local_1d0 = *plVar5;
    local_1e0 = (long *)*plVar4;
  }
  local_1d8 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1e0);
  paVar1 = &local_220.field_2;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_220.field_2._M_allocated_capacity = *psVar6;
    local_220.field_2._8_8_ = plVar4[3];
    local_220._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_220.field_2._M_allocated_capacity = *psVar6;
    local_220._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_220._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_1c0,(ulong)local_220._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != paVar1) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0,local_1d0 + 1);
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200,local_1f0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178,local_168 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((local_158->fixed == true) && ((type->type).base_type == BASE_TYPE_STRUCT)) {
    local_220._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_220,local_130._M_dataplus._M_p,
               local_130._M_dataplus._M_p + local_130._M_string_length);
    std::__cxx11::string::append((char *)&local_220);
    std::__cxx11::string::_M_append((char *)local_1c0,(ulong)local_220._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != paVar1) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::string::append((char *)local_1c0);
  GenIndents_abi_cxx11_(&local_50,this,3);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_f0 = &local_e0;
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_e0 = *plVar5;
    lStack_d8 = plVar4[3];
  }
  else {
    local_e0 = *plVar5;
    local_f0 = (long *)*plVar4;
  }
  local_e8 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_70[0]);
  local_d0 = &local_c0;
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_c0 = *plVar5;
    lStack_b8 = plVar4[3];
  }
  else {
    local_c0 = *plVar5;
    local_d0 = (long *)*plVar4;
  }
  local_c8 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_140 = *puVar7;
    lStack_138 = plVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar7;
    local_150 = (ulong *)*plVar4;
  }
  local_148 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  Namer::ObjectType(&local_110,&this_00->super_Namer,&local_130);
  uVar8 = 0xf;
  if (local_150 != &local_140) {
    uVar8 = local_140;
  }
  if (uVar8 < local_110._M_string_length + local_148) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      uVar9 = local_110.field_2._M_allocated_capacity;
    }
    if (local_110._M_string_length + local_148 <= (ulong)uVar9) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_150);
      goto LAB_0028d257;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_110._M_dataplus._M_p);
LAB_0028d257:
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  psVar6 = puVar3 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_198.field_2._M_allocated_capacity = *psVar6;
    local_198.field_2._8_8_ = puVar3[3];
  }
  else {
    local_198.field_2._M_allocated_capacity = *psVar6;
    local_198._M_dataplus._M_p = (pointer)*puVar3;
  }
  local_198._M_string_length = puVar3[1];
  *puVar3 = psVar6;
  puVar3[1] = 0;
  *(undefined1 *)psVar6 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_198);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_168 = *plVar5;
    lStack_160 = plVar4[3];
    local_178 = &local_168;
  }
  else {
    local_168 = *plVar5;
    local_178 = (long *)*plVar4;
  }
  local_170 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_178,(ulong)local_90[0]);
  psVar6 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_1b8.field_2._M_allocated_capacity = *psVar6;
    local_1b8.field_2._8_8_ = plVar4[3];
    local_1b8._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_1b8.field_2._M_allocated_capacity = *psVar6;
    local_1b8._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_1b8._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1b8);
  local_200 = &local_1f0;
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_1f0 = *puVar7;
    lStack_1e8 = plVar4[3];
  }
  else {
    local_1f0 = *puVar7;
    local_200 = (ulong *)*plVar4;
  }
  local_1f8 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_200,(ulong)local_b0[0]);
  local_1e0 = &local_1d0;
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_1d0 = *plVar5;
    lStack_1c8 = plVar4[3];
  }
  else {
    local_1d0 = *plVar5;
    local_1e0 = (long *)*plVar4;
  }
  local_1d8 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1e0);
  psVar6 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_220.field_2._M_allocated_capacity = *psVar6;
    local_220.field_2._8_8_ = plVar4[3];
    local_220._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_220.field_2._M_allocated_capacity = *psVar6;
    local_220._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_220._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_1c0,(ulong)local_220._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != paVar1) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0,local_1d0 + 1);
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200,local_1f0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178,local_168 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((local_158->fixed == true) && ((type->type).base_type == BASE_TYPE_STRUCT)) {
    local_220._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_220,local_130._M_dataplus._M_p,
               local_130._M_dataplus._M_p + local_130._M_string_length);
    std::__cxx11::string::append((char *)&local_220);
    std::__cxx11::string::_M_append((char *)local_1c0,(ulong)local_220._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != paVar1) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::string::append((char *)local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  return;
}

Assistant:

void GenUnPackForStruct(const StructDef &struct_def, const FieldDef &field,
                          std::string *code_ptr) const {
    auto &code = *code_ptr;
    const auto struct_var = namer_.Variable(struct_def);
    const auto field_field = namer_.Field(field);
    const auto field_method = namer_.Method(field);
    auto field_type = TypeName(field);

    if (parser_.opts.include_dependence_headers) {
      auto package_reference = GenPackageReference(field.value.type);
      field_type = package_reference + "." + TypeName(field);
    }

    code += GenIndents(2) + "if " + struct_var + "." + field_method + "(";
    // if field is a struct, we need to create an instance for it first.
    if (struct_def.fixed && field.value.type.base_type == BASE_TYPE_STRUCT) {
      code += field_type + "()";
    }
    code += ") is not None:";
    code += GenIndents(3) + "self." + field_field + " = " +
            namer_.ObjectType(field_type) + +".InitFromObj(" + struct_var +
            "." + field_method + "(";
    // A struct's accessor requires a struct buf instance.
    if (struct_def.fixed && field.value.type.base_type == BASE_TYPE_STRUCT) {
      code += field_type + "()";
    }
    code += "))";
  }